

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O1

void __thiscall
slang::ast::Expression::visit<slang::ast::(anonymous_namespace)::PortBackrefVisitor&>
          (Expression *this,PortBackrefVisitor *visitor)

{
  IndexSetter *setter;
  StreamExpression *stream;
  
  (*(code *)(&DAT_0054b978 + *(int *)(&DAT_0054b978 + (ulong)this->kind * 4)))();
  return;
}

Assistant:

decltype(auto) Expression::visit(TVisitor&& visitor, Args&&... args) const {
    return visitExpression(this, visitor, std::forward<Args>(args)...);
}